

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter.cpp
# Opt level: O1

double testExtendedKalmanFilterLTV(void)

{
  double **ppdVar1;
  double **ppdVar2;
  double *pdVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  Scalar SVar8;
  double *pdVar9;
  Index IVar10;
  undefined8 __ptr;
  undefined8 uVar11;
  uint uVar12;
  Index size;
  DenseStorage<double,__1,__1,_1,_0> *pDVar13;
  undefined8 *puVar14;
  double *pdVar15;
  char *pcVar16;
  Index index;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar17;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar18;
  ActualDstType actualDst_1;
  long lVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  undefined1 *puVar23;
  ActualDstType actualDst;
  undefined4 uVar24;
  undefined4 uVar25;
  Cmatrix c;
  Pmatrix p;
  StateVector x;
  StateVector xh;
  StateVector v;
  StateVector error;
  Qmatrix q1;
  StateVector dx;
  Rmatrix r;
  Rmatrix r1;
  KalmanFunctorLTV func;
  Qmatrix q;
  StateVector xk [1001];
  InputVector uk [1001];
  MeasureVector yk [1000];
  lagged_fibonacci1279 gen_;
  undefined1 local_e548 [8];
  Matrix<double,__1,__1,_0,__1,__1> local_e540;
  double local_e528;
  scalar_sum_op<double,_double> local_e519;
  Matrix<double,__1,__1,_0,__1,__1> local_e518;
  InputVector local_e500;
  undefined1 local_e4f0 [16];
  Matrix<double,__1,__1,_0,__1,__1> local_e4e0;
  undefined8 local_e4c8;
  Matrix<double,__1,__1,_0,__1,__1> *local_e4b8;
  long lStack_e4b0;
  Matrix<double,__1,__1,_0,__1,__1> local_e4a8;
  void *local_e490 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_e480;
  long local_e468;
  Matrix<double,__1,__1,_0,__1,__1> local_e460;
  undefined1 local_e448 [8];
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::aligned_allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_e440;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::aligned_allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  vStack_e428;
  double *local_e410;
  Index IStack_e408;
  DenseStorage<double,__1,__1,_1,_0> *local_e400;
  Matrix<double,__1,__1,_0,__1,__1> *pMStack_e3f8;
  void *local_e3f0;
  DenseStorage<double,__1,__1,_1,_0> *apDStack_e3e8 [2];
  DenseStorage<double,__1,__1,_1,_0> local_e3d8;
  ulong local_e3c8;
  undefined8 local_e3c0;
  undefined1 local_a558 [16];
  Matrix<double,__1,__1,_0,__1,__1> *local_a548 [2];
  undefined1 local_a538 [15984];
  double *apdStack_66c8 [2];
  DenseStorage<double,__1,__1,_1,_0> local_66b8;
  ulong local_66a8;
  lagged_fibonacci_01_engine<double,_48,_1279U,_418U> local_2830;
  
  if ((testExtendedKalmanFilterLTV()::f == '\0') &&
     (iVar20 = __cxa_guard_acquire(&testExtendedKalmanFilterLTV()::f), iVar20 != 0)) {
    stateObservation::ExtendedKalmanFilter::ExtendedKalmanFilter
              ((ExtendedKalmanFilter *)testExtendedKalmanFilterLTV()::f,4,3,1,true,true);
    __cxa_atexit(stateObservation::ExtendedKalmanFilter::~ExtendedKalmanFilter,
                 testExtendedKalmanFilterLTV()::f,&__dso_handle);
    __cxa_guard_release(&testExtendedKalmanFilterLTV()::f);
  }
  stateObservation::DynamicalSystemFunctorBase::DynamicalSystemFunctorBase
            ((DynamicalSystemFunctorBase *)local_e448);
  local_e448 = (undefined1  [8])&PTR__KalmanFunctorLTV_00121c20;
  local_e440.
  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::aligned_allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e440.
  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::aligned_allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e440.
  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::aligned_allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_e428.
  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::aligned_allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_e428.
  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::aligned_allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_e428.
  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::aligned_allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e410 = (double *)0x0;
  IStack_e408 = 0;
  local_e400 = (DenseStorage<double,__1,__1,_1,_0> *)0x0;
  pMStack_e3f8 = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
  stateObservation::ObserverBase::stateVectorRandom();
  IVar10 = IStack_e408;
  pdVar9 = local_e410;
  local_e410 = local_e3d8.m_data;
  IStack_e408 = local_e3d8.m_rows;
  local_e3d8.m_data = pdVar9;
  local_e3d8.m_rows = IVar10;
  free(pdVar9);
  stateObservation::ObserverBase::measureVectorRandom();
  pMVar17 = pMStack_e3f8;
  pDVar13 = local_e400;
  local_e400 = (DenseStorage<double,__1,__1,_1,_0> *)local_e3d8.m_data;
  pMStack_e3f8 = (Matrix<double,__1,__1,_0,__1,__1> *)local_e3d8.m_rows;
  local_e3d8.m_data = (double *)pDVar13;
  local_e3d8.m_rows = (Index)pMVar17;
  free(pDVar13);
  iVar20 = 0x3e9;
  do {
    stateObservation::KalmanFilterBase::getAmatrixRandom();
    if ((long)(local_66a8 | local_66b8.m_rows) < 0) goto LAB_00109b0a;
    local_e3d8.m_rows = local_66b8.m_rows;
    local_e3c8 = local_66a8;
    local_e3c0 = 0x3fe0000000000000;
    local_e3d8.m_data = (double *)&local_66b8;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_a548,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                *)&local_e3d8);
    std::
    vector<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::aligned_allocator<Eigen::Matrix<double,-1,-1,0,-1,-1>>>
    ::emplace_back<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((vector<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                *)&local_e440,(Matrix<double,__1,__1,_0,__1,__1> *)local_a548);
    free(local_a548[0]);
    free(local_66b8.m_data);
    stateObservation::KalmanFilterBase::getCmatrixRandom();
    std::
    vector<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::aligned_allocator<Eigen::Matrix<double,-1,-1,0,-1,-1>>>
    ::emplace_back<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((vector<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                *)&vStack_e428,(Matrix<double,__1,__1,_0,__1,__1> *)&local_e3d8);
    free(local_e3d8.m_data);
    iVar20 = iVar20 + -1;
  } while (iVar20 != 0);
  stateObservation::ExtendedKalmanFilter::setFunctor
            ((DynamicalSystemFunctorBase *)testExtendedKalmanFilterLTV()::f);
  memset(&local_e3d8,0,0x3e90);
  memset(&local_66b8,0,16000);
  memset(local_a548,0,0x3e90);
  stateObservation::ObserverBase::stateVectorZero();
  boost::random::lagged_fibonacci_01_engine<double,_48,_1279U,_418U>::seed
            (&local_2830,
             &boost::random::lagged_fibonacci_01_engine<double,48,1279u,418u>::default_seed);
  stateObservation::KalmanFilterBase::getRmatrixRandom();
  if (-1 < (local_e4a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols | local_e4a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows)) {
    local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
         local_e4a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows;
    local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         local_e4a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_cols;
    local_e4c8 = 0x3f847ae147ae147b;
    local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)&local_e4a8;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_e460,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                *)&local_e4e0);
    free(local_e4a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data);
    stateObservation::KalmanFilterBase::getQmatrixRandom();
    if (-1 < (local_e480.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols | local_e480.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows)) {
      local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           local_e480.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
      local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           local_e480.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
      local_e4c8 = 0x3f847ae147ae147b;
      local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)&local_e480;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_e4a8,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                  *)&local_e4e0);
      free(local_e480.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)&local_e460;
      local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           (Index)local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_e480,
                 (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                  *)&local_e4e0);
      local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)&local_e4a8;
      local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           (Index)local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_e3f0,
                 (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                  *)&local_e4e0);
      IVar10 = local_e500.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
      pdVar9 = local_e500.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      if (local_e3d8.m_rows !=
          local_e500.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         ) {
        if (local_e500.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows < 0) {
LAB_00109aeb:
          __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                        "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                       );
        }
        free(local_e3d8.m_data);
        if ((Matrix<double,__1,__1,_0,__1,__1> *)IVar10 == (Matrix<double,__1,__1,_0,__1,__1> *)0x0)
        {
          pDVar13 = (DenseStorage<double,__1,__1,_1,_0> *)0x0;
        }
        else {
          if ((Matrix<double,__1,__1,_0,__1,__1> *)0x1fffffffffffffff < (ulong)IVar10) {
LAB_001090c5:
            puVar14 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar14 = stateObservation::ExtendedKalmanFilter::getCMatrixFD;
            __cxa_throw(puVar14,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          pDVar13 = (DenseStorage<double,__1,__1,_1,_0> *)malloc(IVar10 * 8);
          if ((Matrix<double,__1,__1,_0,__1,__1> *)IVar10 !=
              (Matrix<double,__1,__1,_0,__1,__1> *)0x1 && ((ulong)pDVar13 & 0xf) != 0) {
LAB_00109b76:
            __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                          ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                          "void *Eigen::internal::aligned_malloc(std::size_t)");
          }
          if (pDVar13 == (DenseStorage<double,__1,__1,_1,_0> *)0x0) goto LAB_001090c5;
        }
        local_e3d8.m_rows = IVar10;
        local_e3d8.m_data = (double *)pDVar13;
      }
      if (local_e3d8.m_rows != IVar10) {
LAB_00109b29:
        pcVar16 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
        ;
LAB_00109b3e:
        __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar16);
      }
      pMVar17 = (Matrix<double,__1,__1,_0,__1,__1> *)
                (local_e3d8.m_rows - (local_e3d8.m_rows >> 0x3f) & 0xfffffffffffffffe);
      if (1 < local_e3d8.m_rows) {
        lVar21 = 0;
        do {
          pdVar4 = pdVar9 + lVar21;
          dVar7 = pdVar4[1];
          ((double **)local_e3d8.m_data)[lVar21] = (double *)*pdVar4;
          ((double **)local_e3d8.m_data + lVar21)[1] = (double *)dVar7;
          lVar21 = lVar21 + 2;
        } while (lVar21 < (long)pMVar17);
      }
      if ((long)pMVar17 < local_e3d8.m_rows) {
        do {
          ((double **)local_e3d8.m_data)[(long)pMVar17] = (double *)pdVar9[(long)pMVar17];
          pMVar17 = (Matrix<double,__1,__1,_0,__1,__1> *)
                    ((long)&(pMVar17->
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                            m_storage.m_data + 1);
        } while ((Matrix<double,__1,__1,_0,__1,__1> *)local_e3d8.m_rows != pMVar17);
      }
      stateObservation::ObserverBase::inputVectorRandom();
      pMVar18 = local_a548[1];
      pMVar17 = local_a548[0];
      local_a548[0] =
           (Matrix<double,__1,__1,_0,__1,__1> *)
           local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data;
      local_a548[1] =
           (Matrix<double,__1,__1,_0,__1,__1> *)
           local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
      local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)pMVar17;
      local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           (Index)pMVar18;
      free(pMVar17);
      lVar21 = 1;
      do {
        stateObservation::ObserverBase::stateVectorZero();
        for (lVar19 = 0; uVar12 = stateObservation::ObserverBase::getStateSize(),
            (uint)lVar19 < uVar12; lVar19 = lVar19 + 1) {
          dVar7 = boost::random::detail::unit_normal_distribution<double>::operator()
                            ((unit_normal_distribution<double> *)&local_e518,&local_2830);
          if (local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows <= lVar19) goto LAB_00109a58;
          (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data)->m_storage).m_data)[lVar19] = (double *)(dVar7 + 0.0);
        }
        if (local_e4a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols != local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows) {
LAB_00109a77:
          __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                        ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                        "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                       );
        }
        local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
             = (double *)&local_e4a8;
        local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
             = (Index)&local_e4e0;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)&local_e4e0,
                   (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                    *)&local_e518,(assign_op<double,_double> *)&local_e540,(type)0x0);
        stateObservation::ObserverBase::measureVectorZero();
        for (lVar19 = 0; uVar12 = stateObservation::ObserverBase::getMeasureSize(),
            (uint)lVar19 < uVar12; lVar19 = lVar19 + 1) {
          dVar7 = boost::random::detail::unit_normal_distribution<double>::operator()
                            ((unit_normal_distribution<double> *)&local_e540,&local_2830);
          if (local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows <= lVar19) goto LAB_00109a58;
          (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data)->m_storage).m_data)[lVar19] = (double *)(dVar7 + 0.0);
        }
        if (local_e460.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols != local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows) goto LAB_00109a77;
        local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
             = (double *)&local_e460;
        local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
             = (Index)&local_e518;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)&local_e518,
                   (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                    *)&local_e540,(assign_op<double,_double> *)local_e4f0,(type)0x0);
        stateObservation::ObserverBase::inputVectorRandom();
        lVar19 = lVar21 * 0x10;
        pMVar17 = local_a548[lVar21 * 2];
        pMVar18 = *(Matrix<double,__1,__1,_0,__1,__1> **)(local_a538 + lVar19 + -8);
        local_a548[lVar21 * 2] =
             (Matrix<double,__1,__1,_0,__1,__1> *)
             local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data;
        *(Index *)(local_a538 + lVar19 + -8) =
             local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
        local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
             = (double *)pMVar17;
        local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
             = (Index)pMVar18;
        free(pMVar17);
        local_e468 = (lVar21 + -1) * 0x10;
        local_e528 = (double)lVar21;
        testExtendedKalmanFilterLTV()::KalmanFunctorLTV::stateDynamics(Eigen::
        Matrix<double,-1,1,0,-1,1>const&,Eigen::Matrix<double,_1,1,0,_1,1>_const__unsigned_int_
                  ((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                    *)&local_e540,(StateVector *)local_e448,&local_e500,
                   (int)local_e548 + (int)local_e468 + 0x4000);
        IVar10 = local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        pdVar4 = local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
        pdVar9 = local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
        if (local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows != local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows) {
LAB_00109a96:
          pcVar16 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_00109aab;
        }
        if (local_e500.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows != local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows) {
          if (local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows < 0) goto LAB_00109aeb;
          free(local_e500.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
          if ((Matrix<double,__1,__1,_0,__1,__1> *)IVar10 ==
              (Matrix<double,__1,__1,_0,__1,__1> *)0x0) {
            pdVar15 = (double *)0x0;
          }
          else {
            if ((Matrix<double,__1,__1,_0,__1,__1> *)0x1fffffffffffffff < (ulong)IVar10) {
LAB_00109b48:
              puVar14 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar14 = stateObservation::ExtendedKalmanFilter::getCMatrixFD;
              __cxa_throw(puVar14,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            pdVar15 = (double *)malloc(IVar10 * 8);
            if ((Matrix<double,__1,__1,_0,__1,__1> *)IVar10 !=
                (Matrix<double,__1,__1,_0,__1,__1> *)0x1 && ((ulong)pdVar15 & 0xf) != 0)
            goto LAB_00109b76;
            if (pdVar15 == (double *)0x0) goto LAB_00109b48;
          }
          local_e500.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
               = IVar10;
          local_e500.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
               = pdVar15;
        }
        if (local_e500.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows != IVar10) {
LAB_00109ab5:
          pcVar16 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
          ;
          goto LAB_00109b3e;
        }
        pMVar17 = (Matrix<double,__1,__1,_0,__1,__1> *)
                  (local_e500.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows -
                   (local_e500.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe);
        if (1 < local_e500.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows) {
          lVar22 = 0;
          do {
            ppdVar1 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pdVar9)->
                       m_storage).m_data + lVar22;
            ppdVar2 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pdVar4)->
                       m_storage).m_data + lVar22;
            dVar7 = (double)ppdVar1[1] + (double)ppdVar2[1];
            auVar5._8_4_ = SUB84(dVar7,0);
            auVar5._0_8_ = (double)*ppdVar1 + (double)*ppdVar2;
            auVar5._12_4_ = (int)((ulong)dVar7 >> 0x20);
            *(undefined1 (*) [16])
             (local_e500.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data + lVar22) = auVar5;
            lVar22 = lVar22 + 2;
          } while (lVar22 < (long)pMVar17);
        }
        if ((long)pMVar17 <
            local_e500.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows) {
          do {
            local_e500.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data[(long)pMVar17] =
                 (double)(&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pdVar9)->
                           m_storage).m_data)[(long)pMVar17] +
                 (double)(&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pdVar4)->
                           m_storage).m_data)[(long)pMVar17];
            pMVar17 = (Matrix<double,__1,__1,_0,__1,__1> *)
                      ((long)&(pMVar17->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                              m_storage.m_data + 1);
          } while ((Matrix<double,__1,__1,_0,__1,__1> *)
                   local_e500.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows != pMVar17);
        }
        free(local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        IVar10 = local_e500.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                 .m_rows;
        pdVar9 = local_e500.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                 .m_data;
        if ((Matrix<double,__1,__1,_0,__1,__1> *)(&local_e3d8)[lVar21].m_rows !=
            (Matrix<double,__1,__1,_0,__1,__1> *)
            local_e500.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows) {
          if (local_e500.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows < 0) goto LAB_00109aeb;
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                    (&local_e3d8 + lVar21,
                     local_e500.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows,
                     local_e500.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows,1);
        }
        pMVar17 = (Matrix<double,__1,__1,_0,__1,__1> *)(&local_e3d8)[lVar21].m_rows;
        if (pMVar17 != (Matrix<double,__1,__1,_0,__1,__1> *)IVar10) goto LAB_00109b29;
        pdVar4 = (&local_e3d8)[lVar21].m_data;
        pMVar18 = (Matrix<double,__1,__1,_0,__1,__1> *)
                  ((long)pMVar17 - ((long)pMVar17 >> 0x3f) & 0xfffffffffffffffe);
        if (1 < (long)pMVar17) {
          lVar21 = 0;
          do {
            pdVar15 = pdVar9 + lVar21;
            dVar7 = pdVar15[1];
            pdVar3 = pdVar4 + lVar21;
            *pdVar3 = *pdVar15;
            pdVar3[1] = dVar7;
            lVar21 = lVar21 + 2;
          } while (lVar21 < (long)pMVar18);
        }
        if ((long)pMVar18 < (long)pMVar17) {
          do {
            pdVar4[(long)pMVar18] = pdVar9[(long)pMVar18];
            pMVar18 = (Matrix<double,__1,__1,_0,__1,__1> *)
                      ((long)&(pMVar18->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                              m_storage.m_data + 1);
          } while (pMVar17 != pMVar18);
        }
        testExtendedKalmanFilterLTV()::KalmanFunctorLTV::measureDynamics(Eigen::
        Matrix<double,-1,1,0,-1,1>const&,Eigen::Matrix<double,_1,1,0,_1,1>_const__unsigned_int_
                  (&local_e540,(StateVector *)local_e448,&local_e500,
                   (int)local_e548 + (int)lVar19 + 0x4000);
        lVar21 = local_e468;
        IVar10 = local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        pdVar4 = local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
        pdVar9 = local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
        if (local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows != local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows) goto LAB_00109a96;
        pDVar13 = (DenseStorage<double,__1,__1,_1,_0> *)((long)&local_66b8.m_data + local_e468);
        if (*(Matrix<double,__1,__1,_0,__1,__1> **)((long)&local_66b8.m_rows + local_e468) !=
            (Matrix<double,__1,__1,_0,__1,__1> *)
            local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows) {
          if (local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows < 0) goto LAB_00109aeb;
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                    (pDVar13,local_e518.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_rows,
                     local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows,1);
        }
        pMVar17 = *(Matrix<double,__1,__1,_0,__1,__1> **)((long)&local_66b8.m_rows + lVar21);
        if (pMVar17 != (Matrix<double,__1,__1,_0,__1,__1> *)IVar10) goto LAB_00109ab5;
        pdVar15 = pDVar13->m_data;
        pMVar18 = (Matrix<double,__1,__1,_0,__1,__1> *)
                  ((long)pMVar17 - ((long)pMVar17 >> 0x3f) & 0xfffffffffffffffe);
        if (1 < (long)pMVar17) {
          lVar21 = 0;
          do {
            ppdVar1 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pdVar9)->
                       m_storage).m_data + lVar21;
            ppdVar2 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pdVar4)->
                       m_storage).m_data + lVar21;
            dVar7 = (double)ppdVar1[1] + (double)ppdVar2[1];
            auVar6._8_4_ = SUB84(dVar7,0);
            auVar6._0_8_ = (double)*ppdVar1 + (double)*ppdVar2;
            auVar6._12_4_ = (int)((ulong)dVar7 >> 0x20);
            *(undefined1 (*) [16])(pdVar15 + lVar21) = auVar6;
            lVar21 = lVar21 + 2;
          } while (lVar21 < (long)pMVar18);
        }
        if ((long)pMVar18 < (long)pMVar17) {
          do {
            pdVar15[(long)pMVar18] =
                 (double)(&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pdVar9)->
                           m_storage).m_data)[(long)pMVar18] +
                 (double)(&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pdVar4)->
                           m_storage).m_data)[(long)pMVar18];
            pMVar18 = (Matrix<double,__1,__1,_0,__1,__1> *)
                      ((long)&(pMVar18->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                              m_storage.m_data + 1);
          } while (pMVar17 != pMVar18);
        }
        free(local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        free(local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        free(local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        lVar21 = (long)local_e528 + 1;
      } while (lVar21 != 0x3e9);
      stateObservation::ObserverBase::stateVectorRandom();
      stateObservation::ZeroDelayObserver::setState
                ((Matrix *)testExtendedKalmanFilterLTV()::f,(uint)local_e4f0);
      stateObservation::KalmanFilterBase::getPmatrixZero();
      for (lVar21 = 0; uVar12 = stateObservation::ObserverBase::getStateSize(),
          (uint)lVar21 < uVar12; lVar21 = lVar21 + 1) {
        if ((long)local_e4f0._8_8_ <= lVar21) goto LAB_00109a58;
        if ((local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows <= lVar21) ||
           (local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols <= lVar21)) goto LAB_00109acc;
        (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
           local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data)->m_storage).m_data)
        [local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows * lVar21 + lVar21] =
             (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_e4f0._0_8_)->
               m_storage).m_data)[lVar21];
      }
      local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)&local_e518;
      local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           (Index)&local_e518;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_e4e0,
                 (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                  *)&local_e540);
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                (&local_e518,&local_e4e0,(assign_op<double,_double> *)local_e490);
      free(local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      stateObservation::KalmanFilterBase::setStateCovariance
                ((Matrix *)testExtendedKalmanFilterLTV()::f);
      stateObservation::KalmanFilterBase::setR((Matrix *)testExtendedKalmanFilterLTV()::f);
      stateObservation::KalmanFilterBase::setQ((Matrix *)testExtendedKalmanFilterLTV()::f);
      stateObservation::ZeroDelayObserver::setInput
                ((Matrix *)testExtendedKalmanFilterLTV()::f,(uint)local_a548);
      for (lVar21 = 0; uVar12 = stateObservation::ObserverBase::getStateSize(),
          (uint)lVar21 < uVar12; lVar21 = lVar21 + 1) {
        if ((long)local_e4f0._8_8_ <= lVar21) {
LAB_00109a58:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        if ((local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows <= lVar21) ||
           (local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols <= lVar21)) {
LAB_00109acc:
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                       );
        }
        (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
           local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data)->m_storage).m_data)
        [local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows * lVar21 + lVar21] =
             (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_e4f0._0_8_)->
               m_storage).m_data)[lVar21];
      }
      local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)&local_e518;
      local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           (Index)&local_e518;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_e4e0,
                 (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                  *)&local_e540);
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                (&local_e518,&local_e4e0,(assign_op<double,_double> *)local_e490);
      free(local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      stateObservation::ObserverBase::stateVectorConstant(1.0);
      if (-1 < local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_rows) {
        local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
             = local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_rows;
        local_e4c8 = 0x3e45798ee2308c3a;
        local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
             = (double *)&local_e540;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_e490,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                    *)&local_e4e0);
        free(local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        lVar21 = -1000;
        puVar23 = local_a538;
        pDVar13 = &local_66b8;
        do {
          stateObservation::ZeroDelayObserver::setMeasurement
                    ((Matrix *)testExtendedKalmanFilterLTV()::f,(uint)pDVar13);
          stateObservation::ZeroDelayObserver::setInput
                    ((Matrix *)testExtendedKalmanFilterLTV()::f,(uint)puVar23);
          stateObservation::ExtendedKalmanFilter::getAMatrixFD((Matrix *)&local_e4e0);
          stateObservation::ExtendedKalmanFilter::getCMatrixFD((Matrix *)&local_e540);
          stateObservation::KalmanFilterBase::setA((Matrix *)testExtendedKalmanFilterLTV()::f);
          stateObservation::KalmanFilterBase::setC((Matrix *)testExtendedKalmanFilterLTV()::f);
          stateObservation::ZeroDelayObserver::getEstimatedState((uint)&local_e4b8);
          uVar11 = local_e4f0._8_8_;
          __ptr = local_e4f0._0_8_;
          local_e4f0._0_8_ = local_e4b8;
          local_e4f0._8_8_ = lStack_e4b0;
          local_e4b8 = (Matrix<double,__1,__1,_0,__1,__1> *)__ptr;
          lStack_e4b0 = uVar11;
          free((void *)__ptr);
          free(local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_data);
          free(local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_data);
          puVar23 = puVar23 + 0x10;
          pDVar13 = pDVar13 + 1;
          lVar21 = lVar21 + 1;
        } while (lVar21 != 0);
        local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
             = (Index)local_a558;
        local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
             = (double *)local_e4f0;
        if (local_e4f0._8_8_ == local_a558._8_8_) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
          PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_e4b8,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)&local_e4e0);
          local_e540.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data = (double *)&local_e4b8;
          if (lStack_e4b0 == 0) {
            uVar24 = 0;
            uVar25 = 0;
          }
          else {
            if (lStack_e4b0 < 1) {
              __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                            "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                            "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                           );
            }
            local_e4e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows = (Index)local_e4b8;
            SVar8 = Eigen::internal::
                    redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                    ::
                    run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                              ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                *)&local_e4e0,&local_e519,
                               (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                *)&local_e540);
            uVar24 = SUB84(SVar8,0);
            uVar25 = (undefined4)((ulong)SVar8 >> 0x20);
          }
          local_e528 = (double)CONCAT44(uVar25,uVar24);
          free(local_e4b8);
          free(local_e490[0]);
          free(local_e518.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_data);
          free((void *)local_e4f0._0_8_);
          free(local_e3f0);
          free(local_e480.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_data);
          free(local_e4a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_data);
          free(local_e460.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_data);
          free(local_e500.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
          lVar21 = 0x3e90;
          do {
            free(*(void **)(local_a558 + lVar21));
            lVar21 = lVar21 + -0x10;
          } while (lVar21 != 0);
          lVar21 = 16000;
          do {
            free(*(void **)((long)apdStack_66c8 + lVar21));
            lVar21 = lVar21 + -0x10;
          } while (lVar21 != 0);
          lVar21 = 0x3e90;
          do {
            free(*(void **)((long)apDStack_e3e8 + lVar21));
            lVar21 = lVar21 + -0x10;
          } while (lVar21 != 0);
          local_e528 = SQRT(local_e528);
          local_e448 = (undefined1  [8])&PTR__KalmanFunctorLTV_00121c20;
          free(local_e400);
          free(local_e410);
          std::
          vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::~vector(&vStack_e428);
          std::
          vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::~vector(&local_e440);
          stateObservation::DynamicalSystemFunctorBase::~DynamicalSystemFunctorBase
                    ((DynamicalSystemFunctorBase *)local_e448);
          return local_e528;
        }
        pcVar16 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
        ;
LAB_00109aab:
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar16);
      }
      pcVar16 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_00109b1f;
    }
  }
LAB_00109b0a:
  pcVar16 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
  ;
LAB_00109b1f:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar16);
}

Assistant:

double testExtendedKalmanFilterLTV()
{
    const static unsigned kmax=1000;

    typedef stateObservation::ExtendedKalmanFilter ekf;

    static ekf f(4,3,1);


    struct KalmanFunctorLTV:
                public stateObservation::DynamicalSystemFunctorBase
    {

public:
        KalmanFunctorLTV()
        {
            s_=f.stateVectorRandom();
            n_=f.measureVectorRandom();

            for (unsigned i=0;i<=kmax;++i)
            {
                a.push_back( f.getAmatrixRandom()*0.5 );
                c.push_back( f.getCmatrixRandom() );
            }

        }

        virtual ekf::StateVector stateDynamics(const ekf::StateVector& x, const ekf::InputVector& u, unsigned k)
        {
            ekf::StateVector xk1;
            unsigned kk=std::min(k,kmax);
            xk1=a[kk]*x+(u.transpose()*u)(0,0)*s_;

            return xk1;
        }

        virtual ekf::MeasureVector measureDynamics(const ekf::StateVector& x, const ekf::InputVector &u,unsigned k)
        {
            (void)k;//unused
            (void)u;//unused

            ekf::MeasureVector yk;
            unsigned kk=std::min(k,kmax);
            yk=c[kk]*x+(u.transpose()*u)(0,0)*n_;
            return yk;
        }

        virtual unsigned getStateSize() const
        {
            return f.getStateSize();
        }

        virtual unsigned getInputSize() const
        {
            return f.getInputSize();
        }

        virtual unsigned getMeasurementSize() const
        {
            return f.getMeasureSize();
        }

        std::vector<ekf::Amatrix, Eigen::aligned_allocator<ekf::Amatrix> > a;
        std::vector<ekf::Cmatrix, Eigen::aligned_allocator<ekf::Cmatrix> > c;
private:
        ekf::StateVector s_;
        ekf::MeasureVector n_;
    };


    KalmanFunctorLTV func;

    f.setFunctor(&func);



    ekf::StateVector xk[kmax+1];
    ekf::MeasureVector yk[kmax];
    ekf::InputVector uk[kmax+1];

    ekf::StateVector x=f.stateVectorZero();



    boost::lagged_fibonacci1279 gen_;

    ekf::Rmatrix r1=f.getRmatrixRandom()*0.01;

    ekf::Qmatrix q1=f.getQmatrixRandom()*0.01;

    ekf::Rmatrix r(r1*r1.transpose());
    ekf::Qmatrix q(q1*q1.transpose());

    xk[0]=x;
    uk[0]=f.inputVectorRandom();

    for (unsigned k=1; k<=kmax; ++k)
    {
        ekf::StateVector v(f.stateVectorZero());
        for (unsigned i=0;i<f.getStateSize();++i)
        {
            boost::normal_distribution<> g(0, 1);
            v[i]=g(gen_);
        }
        v=q1*v;

        ekf::MeasureVector w(f.measureVectorZero());
        for (unsigned i=0;i<f.getMeasureSize();++i)
        {
            boost::normal_distribution<> g(0, 1);
            w[i]=g(gen_);
        }
        w=r1*w;

        uk[k]=f.inputVectorRandom();

        x=func.stateDynamics(x,uk[k-1],k-1)+v;

        xk[k]=x;
        yk[k-1]=func.measureDynamics(x,uk[k],k)+w;

    }

    ekf::StateVector xh=f.stateVectorRandom();

    f.setState(xh,0);

    ekf::Pmatrix p=f.getPmatrixZero();

    for (unsigned i=0;i<f.getStateSize();++i)
    {
        p(i,i)=xh[i];
    }
    p=p*p.transpose();


    f.setStateCovariance(p);

    f.setR(r);
    f.setQ(q);

    f.setInput(uk[0],0);

    for (unsigned i=0;i<f.getStateSize();++i)
    {
        p(i,i)=xh[i];
    }
    p=p*p.transpose();

    ekf::StateVector dx=f.stateVectorConstant(1)*1e-8;

    unsigned i;
    for (i=1;i<=kmax;++i)
    {
        f.setMeasurement(yk[i-1],i);
        f.setInput(uk[i],i);


        ekf::Amatrix a=f.getAMatrixFD(dx);
        ekf::Cmatrix c= f.getCMatrixFD(dx);

        f.setA(a);
        f.setC(c);

        xh=f.getEstimatedState(i);
    }

    ekf::StateVector error=xh-xk[kmax];

    return error.norm();

}